

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall testing::internal::MutexBase::Lock(MutexBase *this)

{
  ostream *poVar1;
  pthread_t pVar2;
  pthread_mutex_t *in_RDI;
  int in_stack_0000002c;
  char *in_stack_00000030;
  int gtest_error;
  GTestLog local_10;
  int local_c;
  
  local_c = pthread_mutex_lock(in_RDI);
  if (local_c != 0) {
    GTestLog::GTestLog((GTestLog *)this,gtest_error,in_stack_00000030,in_stack_0000002c);
    poVar1 = GTestLog::GetStream(&local_10);
    poVar1 = std::operator<<(poVar1,"pthread_mutex_lock(&mutex_)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_c);
    GTestLog::~GTestLog((GTestLog *)poVar1);
  }
  pVar2 = pthread_self();
  *(pthread_t *)((long)in_RDI + 0x30) = pVar2;
  in_RDI[1].__size[0] = '\x01';
  return;
}

Assistant:

void Lock() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_lock(&mutex_));
    owner_ = pthread_self();
    has_owner_ = true;
  }